

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall
LFPConsumer::LFPConsumer
          (LFPConsumer *this,HighFreqDataType *hf,int ringbufsize,HFParsingInfo *parseargs)

{
  HighFreqDataType *in_RDI;
  size_t unaff_retaddr;
  HighFreqDataType *in_stack_00000008;
  HFSubConsumer *in_stack_00000010;
  HFParsingInfo *in_stack_ffffffffffffff48;
  HFParsingInfo *in_stack_ffffffffffffff50;
  HighFreqDataType *in_stack_ffffffffffffff58;
  HighFreqDataType *in_stack_ffffffffffffff60;
  HighFreqDataType *filter;
  
  filter = in_RDI;
  HighFreqDataType::HighFreqDataType(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  HFSubConsumer::HFSubConsumer
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(consumer_queue_filter)filter);
  HighFreqDataType::~HighFreqDataType(in_RDI);
  (in_RDI->super_NetworkDataType)._vptr_NetworkDataType = (_func_int **)&PTR__LFPConsumer_003751a8;
  HFParsingInfo::HFParsingInfo(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x1cd716);
  *(undefined4 *)((long)&in_RDI[1].name.field_2 + 8) = 3;
  return;
}

Assistant:

LFPConsumer::LFPConsumer(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs)
    : HFSubConsumer(hf, ringbufsize),
      args(parseargs)
{
    sockType = ST_FILTERED_CONSUMER;
}